

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void printUImm12Offset2(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint id;
  cs_ac_type cVar4;
  MCOperand *op;
  int64_t iVar5;
  undefined4 in_register_00000034;
  int iVar6;
  long val;
  
  op = MCInst_getOperand(MI,2);
  _Var3 = MCOperand_isImm(op);
  if (_Var3) {
    iVar5 = MCOperand_getImm(op);
    val = iVar5 * ((ulong)O & 0xffffffff);
    printInt64Bang((SStream *)CONCAT44(in_register_00000034,OpNum),val);
    h = MI->csh;
    if (h->detail != CS_OPT_OFF) {
      iVar6 = (int)val;
      if (h->doing_mem == true) {
        pcVar2 = MI->flat_insn->detail;
        *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x3d) = iVar6;
      }
      else {
        id = MCInst_getOpcode(MI);
        cVar4 = get_op_access(h,id,(uint)MI->ac_idx);
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar4;
        MI->ac_idx = MI->ac_idx + '\x01';
        pcVar2 = MI->flat_insn->detail;
        puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
        puVar1[0] = '\x02';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) =
             (long)iVar6;
        puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
        *puVar1 = *puVar1 + '\x01';
      }
    }
  }
  return;
}

Assistant:

static void printUImm12Offset2(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	printUImm12Offset(MI, OpNum, Scale, O);
}